

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all-to-all.hpp
# Opt level: O2

void __thiscall
diy::detail::
AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>::
operator()(AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
           *this,Block *b,ReduceProxy *srp,RegularSwapPartners *param_3)

{
  OutgoingQueues *pOVar1;
  pair<int,_int> *ppVar2;
  pointer pBVar3;
  pointer pBVar4;
  int iVar5;
  MemoryBuffer *pMVar6;
  size_t sVar7;
  mapped_type *pmVar8;
  mapped_type *bb;
  mapped_type *bb_00;
  int i;
  ulong uVar9;
  int j;
  ulong uVar10;
  long lVar11;
  int iVar12;
  AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
  *pAVar13;
  pair<int,_int> from_to;
  size_t s;
  AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
  *local_188;
  Block<float> *local_180;
  ReduceProxy *local_178;
  int gid_in;
  int iStack_16c;
  int local_164;
  pair<int,_int> range;
  undefined4 local_158 [2];
  undefined8 local_150;
  undefined4 *local_148;
  undefined4 *local_140;
  undefined8 local_138;
  long local_130;
  AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
  *local_128;
  ulong local_120;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sizes_out;
  _Rb_tree<int,_std::pair<const_int,_diy::MemoryBuffer>,_std::_Select1st<std::pair<const_int,_diy::MemoryBuffer>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
  local_100;
  _Rb_tree<diy::BlockID,_std::pair<const_diy::BlockID,_diy::MemoryBuffer>,_std::_Select1st<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
  local_d0;
  uint local_80;
  pair<int,_int> *local_68;
  pointer pBStack_60;
  pointer local_58;
  pair<int,_int> *local_48;
  pointer pBStack_40;
  pointer local_38;
  
  uVar9 = (ulong)((long)(srp->in_link_).neighbors_.
                        super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(srp->in_link_).neighbors_.
                       super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  uVar10 = (ulong)((long)(srp->out_link_).neighbors_.
                         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(srp->out_link_).neighbors_.
                        super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 3;
  iVar5 = (int)uVar10;
  iVar12 = (int)uVar9;
  if (iVar5 == 0 && iVar12 == 0) {
    ReduceProxy::ReduceProxy
              ((ReduceProxy *)&sizes_out,&srp->super_Proxy,srp->block_,0,srp->assigner_,
               &this->empty_link,&this->all_neighbors_link);
    SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger::operator()
              (this->op,b,(ReduceProxy *)&sizes_out);
    pMVar6 = Master::Proxy::incoming((Proxy *)&sizes_out,local_48->first);
    range = *local_48;
    pmVar8 = std::
             map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
             ::operator[]((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                           *)&local_d0,(key_type *)&range);
    MemoryBuffer::swap(pMVar6,pmVar8);
    pMVar6->position = 0;
    std::
    _Rb_tree<diy::BlockID,_std::pair<const_diy::BlockID,_diy::MemoryBuffer>,_std::_Select1st<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
    ::clear(&local_d0);
    pBVar4 = local_58;
    pBVar3 = pBStack_60;
    ppVar2 = local_68;
    local_80 = 1;
    local_58 = local_38;
    local_68 = local_48;
    pBStack_60 = pBStack_40;
    local_48 = ppVar2;
    pBStack_40 = pBVar3;
    local_38 = pBVar4;
    SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger::operator()
              (this->op,b,(ReduceProxy *)&sizes_out);
  }
  else {
    local_178 = srp;
    if (iVar12 == 0) {
      ReduceProxy::ReduceProxy
                ((ReduceProxy *)&sizes_out,&srp->super_Proxy,srp->block_,0,srp->assigner_,
                 &this->empty_link,&this->all_neighbors_link);
      SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger::operator()
                (this->op,b,(ReduceProxy *)&sizes_out);
      local_148 = local_158;
      local_158[0] = 0;
      local_150 = 0;
      local_138 = 0;
      local_140 = local_148;
      std::
      _Rb_tree<diy::BlockID,_std::pair<const_diy::BlockID,_diy::MemoryBuffer>,_std::_Select1st<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
      ::swap((_Rb_tree<diy::BlockID,_std::pair<const_diy::BlockID,_diy::MemoryBuffer>,_std::_Select1st<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
              *)&range,&local_d0);
      uVar9 = (ulong)((long)pBStack_40 - (long)local_48) >> 3;
      pOVar1 = &(srp->super_Proxy).outgoing_;
      local_164 = (int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) /
                       (long)iVar5);
      local_130 = (long)local_164;
      local_128 = (AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
                   *)0x0;
      if (0 < iVar5) {
        local_128 = (AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
                     *)(uVar10 & 0xffffffff);
      }
      uVar9 = 0;
      pAVar13 = (AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
                 *)0x0;
      while (pAVar13 != local_128) {
        local_188 = (AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
                     *)((long)&pAVar13->op + 1);
        local_180 = (Block<float> *)((long)local_188 * local_130);
        from_to.second = (int)local_180;
        from_to.first = (int)local_130 * (int)pAVar13;
        s = *(size_t *)
             ((srp->out_link_).neighbors_.
              super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
              super__Vector_impl_data._M_start + (long)pAVar13);
        pmVar8 = std::
                 map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                 ::operator[](pOVar1,(key_type *)&s);
        Serialization<std::pair<int,_int>_>::save(&pmVar8->super_BinaryBuffer,&from_to);
        local_120 = uVar9;
        for (lVar11 = (long)(int)uVar9; lVar11 < (long)local_180; lVar11 = lVar11 + 1) {
          s = *(size_t *)
               ((srp->out_link_).neighbors_.
                super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                super__Vector_impl_data._M_start + (long)pAVar13);
          _gid_in = (pair<int,_int>)
                    ((long)local_48[lVar11] << 0x20 | (ulong)(uint)(srp->super_Proxy).gid_);
          pmVar8 = std::
                   map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                   ::operator[](pOVar1,(key_type *)&s);
          Serialization<std::pair<int,_int>_>::save(&pmVar8->super_BinaryBuffer,(Pair *)&gid_in);
          s = *(size_t *)
               ((srp->out_link_).neighbors_.
                super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                super__Vector_impl_data._M_start + (long)pAVar13);
          _gid_in = local_48[lVar11];
          pmVar8 = std::
                   map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                   ::operator[]((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                                 *)&range,(key_type *)&gid_in);
          bb = std::
               map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
               ::operator[](pOVar1,(key_type *)&s);
          Serialization<diy::MemoryBuffer>::save(&bb->super_BinaryBuffer,pmVar8);
          srp = local_178;
        }
        uVar9 = (ulong)(uint)((int)local_120 + local_164);
        pAVar13 = local_188;
      }
      std::
      _Rb_tree<diy::BlockID,_std::pair<const_diy::BlockID,_diy::MemoryBuffer>,_std::_Select1st<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
      ::~_Rb_tree((_Rb_tree<diy::BlockID,_std::pair<const_diy::BlockID,_diy::MemoryBuffer>,_std::_Select1st<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                   *)&range);
    }
    else {
      if (iVar5 != 0) {
        range.first = 8;
        range.second = 0;
        local_188 = (AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
                     *)uVar10;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&sizes_out,(long)iVar5,(value_type_conflict5 *)&range,(allocator_type *)&from_to)
        ;
        range.first = 0;
        range.second = 0;
        iVar5 = 0;
        local_180 = (Block<float> *)(uVar9 & 0xffffffff);
        if (iVar12 < 1) {
          local_180 = (Block<float> *)0x0;
        }
        for (uVar9 = 0; (Block<float> *)uVar9 != local_180; uVar9 = uVar9 + 1) {
          pMVar6 = Master::Proxy::incoming
                             (&srp->super_Proxy,
                              (srp->in_link_).neighbors_.
                              super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar9].gid);
          Serialization<std::pair<int,_int>_>::load(&pMVar6->super_BinaryBuffer,&range);
          iVar12 = (range.second - range.first) / (int)local_188;
          from_to.first = 0;
          from_to.second = 0;
          sVar7 = pMVar6->position;
          iVar5 = range.first;
          while (sVar7 < (ulong)((long)(pMVar6->buffer).
                                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(pMVar6->buffer).
                                      super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                      super__Vector_impl_data._M_start)) {
            Serialization<std::pair<int,_int>_>::load(&pMVar6->super_BinaryBuffer,&from_to);
            (*(pMVar6->super_BinaryBuffer)._vptr_BinaryBuffer[4])(pMVar6,&s,8);
            iVar5 = (from_to.second - range.first) / iVar12;
            sizes_out.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[iVar5] =
                 s + sizes_out.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar5] + 0x10;
            sVar7 = pMVar6->position + s;
            pMVar6->position = sVar7;
            iVar5 = range.first;
          }
          pMVar6->position = 0;
          srp = local_178;
        }
        iVar5 = (range.second - iVar5) / (int)local_188;
        iVar12 = 0;
        uVar9 = 0;
        if (0 < (int)local_188) {
          uVar9 = (ulong)local_188 & 0xffffffff;
        }
        pOVar1 = &(srp->super_Proxy).outgoing_;
        local_188 = (AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
                     *)uVar9;
        for (uVar10 = 0;
            local_188 !=
            (AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
             *)uVar10; uVar10 = uVar10 + 1) {
          from_to = *(pair<int,_int> *)
                     ((local_178->out_link_).neighbors_.
                      super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar10);
          pmVar8 = std::
                   map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                   ::operator[](pOVar1,(key_type *)&from_to);
          std::vector<char,_std::allocator<char>_>::reserve
                    (&pmVar8->buffer,
                     sizes_out.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar10]);
          from_to.second = range.first + iVar12 + iVar5;
          from_to.first = range.first + iVar12;
          Serialization<std::pair<int,_int>_>::save(&pmVar8->super_BinaryBuffer,&from_to);
          iVar12 = iVar12 + iVar5;
        }
        for (uVar9 = 0; (Block<float> *)uVar9 != local_180; uVar9 = uVar9 + 1) {
          pMVar6 = Master::Proxy::incoming
                             (&local_178->super_Proxy,
                              (local_178->in_link_).neighbors_.
                              super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar9].gid);
          Serialization<std::pair<int,_int>_>::load(&pMVar6->super_BinaryBuffer,&range);
          from_to.first = 0;
          from_to.second = 0;
          while (pMVar6->position <
                 (ulong)((long)(pMVar6->buffer).super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pMVar6->buffer).super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_start)) {
            Serialization<std::pair<int,_int>_>::load(&pMVar6->super_BinaryBuffer,&from_to);
            s = *(size_t *)
                 ((local_178->out_link_).neighbors_.
                  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                  super__Vector_impl_data._M_start + (from_to.second - range.first) / iVar5);
            pmVar8 = std::
                     map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                     ::operator[](pOVar1,(key_type *)&s);
            Serialization<std::pair<int,_int>_>::save(&pmVar8->super_BinaryBuffer,&from_to);
            MemoryBuffer::copy((EVP_PKEY_CTX *)pMVar6,(EVP_PKEY_CTX *)pmVar8);
          }
        }
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&sizes_out.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        return;
      }
      local_188 = this;
      local_180 = b;
      ReduceProxy::ReduceProxy
                ((ReduceProxy *)&sizes_out,&srp->super_Proxy,srp->block_,1,srp->assigner_,
                 &this->all_neighbors_link,&this->empty_link);
      local_148 = local_158;
      local_158[0] = 0;
      local_150 = 0;
      local_138 = 0;
      local_140 = local_148;
      std::
      _Rb_tree<int,_std::pair<const_int,_diy::MemoryBuffer>,_std::_Select1st<std::pair<const_int,_diy::MemoryBuffer>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
      ::swap((_Rb_tree<int,_std::pair<const_int,_diy::MemoryBuffer>,_std::_Select1st<std::pair<const_int,_diy::MemoryBuffer>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
              *)&range,&local_100);
      from_to.first = 0;
      from_to.second = 0;
      uVar10 = 0;
      uVar9 = uVar9 & 0xffffffff;
      if (iVar12 < 1) {
        uVar9 = uVar10;
      }
      for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
        gid_in = (local_178->in_link_).neighbors_.
                 super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar10].gid;
        bb_00 = std::
                map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                ::operator[]((map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                              *)&range,&gid_in);
        Serialization<std::pair<int,_int>_>::load(&bb_00->super_BinaryBuffer,&from_to);
        while (bb_00->position <
               (ulong)((long)(bb_00->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)(bb_00->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start)) {
          s = 0;
          Serialization<std::pair<int,_int>_>::load(&bb_00->super_BinaryBuffer,(Pair *)&s);
          pMVar6 = Master::Proxy::incoming((Proxy *)&sizes_out,(int)s);
          Serialization<diy::MemoryBuffer>::load(&bb_00->super_BinaryBuffer,pMVar6);
          pMVar6 = Master::Proxy::incoming((Proxy *)&sizes_out,(int)s);
          pMVar6->position = 0;
        }
      }
      SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger::operator()
                (local_188->op,local_180,(ReduceProxy *)&sizes_out);
      std::
      _Rb_tree<int,_std::pair<const_int,_diy::MemoryBuffer>,_std::_Select1st<std::pair<const_int,_diy::MemoryBuffer>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_diy::MemoryBuffer>,_std::_Select1st<std::pair<const_int,_diy::MemoryBuffer>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                   *)&range);
    }
  }
  ReduceProxy::~ReduceProxy((ReduceProxy *)&sizes_out);
  return;
}

Assistant:

void operator()(Block* b, const ReduceProxy& srp, const RegularSwapPartners&) const
    {
      int k_in  = srp.in_link().size();
      int k_out = srp.out_link().size();

      if (k_in == 0 && k_out == 0)  // special case of a single block
      {
          ReduceProxy all_srp(std::move(const_cast<ReduceProxy&>(srp)), srp.block(), 0, srp.assigner(), empty_link, all_neighbors_link);

          op(b, all_srp);

          MemoryBuffer& in_queue = all_srp.incoming(all_srp.out_link().target(0).gid);
          in_queue.swap(all_srp.outgoing(all_srp.out_link().target(0)));
          in_queue.reset();
          all_srp.outgoing()->clear();

          // change to incoming proxy
          all_srp.set_round(1);
          auto& in_link  = const_cast<Link&>(all_srp.in_link());
          auto& out_link = const_cast<Link&>(all_srp.out_link());
          in_link.swap(out_link);

          op(b, all_srp);
          return;
      }

      if (k_in == 0)                // initial round
      {
        ReduceProxy all_srp(std::move(const_cast<ReduceProxy&>(srp)), srp.block(), 0, srp.assigner(), empty_link, all_neighbors_link);
        op(b, all_srp);

        Master::Proxy::OutgoingQueues all_queues;
        all_queues.swap(*all_srp.outgoing());       // clears out the queues and stores them locally

        // enqueue outgoing
        int group = all_srp.out_link().size() / k_out;
        for (int i = 0; i < k_out; ++i)
        {
          std::pair<int,int> range(i*group, (i+1)*group);
          srp.enqueue(srp.out_link().target(i), range);
          for (int j = i*group; j < (i+1)*group; ++j)
          {
            int from = srp.gid();
            int to   = all_srp.out_link().target(j).gid;
            srp.enqueue(srp.out_link().target(i), std::make_pair(from, to));
            srp.enqueue(srp.out_link().target(i), all_queues[all_srp.out_link().target(j)]);
          }
        }
      } else if (k_out == 0)        // final round
      {
        // dequeue incoming + reorder into the correct order
        ReduceProxy all_srp(std::move(const_cast<ReduceProxy&>(srp)), srp.block(), 1, srp.assigner(), all_neighbors_link, empty_link);

        Master::Proxy::IncomingQueues all_incoming;
        all_incoming.swap(*all_srp.incoming());

        std::pair<int, int> range;      // all the ranges should be the same
        for (int i = 0; i < k_in; ++i)
        {
          int gid_in = srp.in_link().target(i).gid;
          MemoryBuffer& in = all_incoming[gid_in];
          load(in, range);
          while(in)
          {
            std::pair<int, int> from_to;
            load(in, from_to);
            load(in, all_srp.incoming(from_to.first));
            all_srp.incoming(from_to.first).reset();
          }
        }

        op(b, all_srp);
      } else                                        // intermediate round: reshuffle queues
      {
        // add up buffer sizes
        std::vector<size_t> sizes_out(k_out, sizeof(std::pair<int,int>));
        std::pair<int, int> range;      // all the ranges should be the same
        for (int i = 0; i < k_in; ++i)
        {
          MemoryBuffer& in = srp.incoming(srp.in_link().target(i).gid);

          load(in, range);
          int group = (range.second - range.first)/k_out;

          std::pair<int, int> from_to;
          size_t s;
          while(in)
          {
            diy::load(in, from_to);
            diy::load(in, s);

            int j = (from_to.second - range.first) / group;
            sizes_out[j] += s + sizeof(size_t) + sizeof(std::pair<int,int>);
            in.skip(s);
          }
          in.reset();
        }

        // reserve outgoing buffers of correct size
        int group = (range.second - range.first)/k_out;
        for (int i = 0; i < k_out; ++i)
        {
          MemoryBuffer& out = srp.outgoing(srp.out_link().target(i));
          out.reserve(sizes_out[i]);

          std::pair<int, int> out_range;
          out_range.first  = range.first + group*i;
          out_range.second = range.first + group*(i+1);
          save(out, out_range);
        }

        // re-direct the queues
        for (int i = 0; i < k_in; ++i)
        {
          MemoryBuffer& in = srp.incoming(srp.in_link().target(i).gid);

          load(in, range);

          std::pair<int, int> from_to;
          while(in)
          {
            load(in, from_to);
            int j = (from_to.second - range.first) / group;

            MemoryBuffer& out = srp.outgoing(srp.out_link().target(j));
            save(out, from_to);
            MemoryBuffer::copy(in, out);
          }
        }
      }
    }